

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemTable.cpp
# Opt level: O0

void __thiscall MemTable::MemTable(MemTable *this)

{
  MemTable *this_local;
  
  Dictionary<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Dictionary(&this->
                super_Dictionary<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              );
  (this->
  super_Dictionary<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  )._vptr_Dictionary = (_func_int **)&PTR_size_00130c68;
  (this->qlist).
  super__List_base<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>._M_impl
  ._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  (this->qlist).
  super__List_base<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>._M_impl
  ._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  (this->qlist).
  super__List_base<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>._M_impl
  ._M_node._M_size = 0;
  std::__cxx11::list<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>::list
            (&this->qlist);
  this->_size = 0;
  this->_size_bytes = 0;
  std::__cxx11::list<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>::
  emplace_back<>(&this->qlist);
  return;
}

Assistant:

MemTable::MemTable() : qlist() {
    qlist.emplace_back();
}